

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void * msort(void *list,void *next,_func_int_varargs *cmp)

{
  long lVar1;
  void *pvVar2;
  size_t offset;
  char *set [30];
  undefined8 local_118 [31];
  
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    local_118[lVar1] = 0;
  }
  offset = (long)next - (long)list;
  while (list != (void *)0x0) {
    pvVar2 = *(void **)(offset + (long)list);
    *(undefined8 *)(offset + (long)list) = 0;
    for (lVar1 = 0; (lVar1 != 0x1d && ((void *)local_118[lVar1] != (void *)0x0)); lVar1 = lVar1 + 1)
    {
      list = merge(list,(void *)local_118[lVar1],cmp,offset);
      local_118[lVar1] = 0;
    }
    local_118[lVar1] = list;
    list = pvVar2;
  }
  pvVar2 = (void *)0x0;
  for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
    if ((void *)local_118[lVar1] != (void *)0x0) {
      pvVar2 = merge((void *)local_118[lVar1],pvVar2,cmp,offset);
    }
  }
  return pvVar2;
}

Assistant:

static void *msort(void *list,void *next,int (*cmp)())
{
  size_t offset;
  char *ep;
  char *set[LISTSIZE];
  int i;
  offset = (size_t)next - (size_t)list;
  for(i=0; i<LISTSIZE; i++) set[i] = 0;
  while( list ){
    ep = list;
    list = NEXT(list);
    NEXT(ep) = 0;
    for(i=0; i<LISTSIZE-1 && set[i]!=0; i++){
      ep = merge(ep,set[i],cmp,offset);
      set[i] = 0;
    }
    set[i] = ep;
  }
  ep = 0;
  for(i=0; i<LISTSIZE; i++) if( set[i] ) ep = merge(set[i],ep,cmp,offset);
  return ep;
}